

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbm.cc
# Opt level: O0

status_t tchecker::dbm::tighten(db_t *dbm,clock_id_t dim,clock_id_t x,clock_id_t y)

{
  bool bVar1;
  uint uVar2;
  db_t local_38;
  db_t local_34;
  uint local_30;
  db_t local_2c;
  clock_id_t j;
  db_t db_ixy;
  clock_id_t i;
  clock_id_t y_local;
  clock_id_t x_local;
  clock_id_t dim_local;
  db_t *dbm_local;
  
  db_ixy = (db_t)y;
  if (dbm == (db_t *)0x0) {
    __assert_fail("dbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0xc0,
                  "enum tchecker::dbm::status_t tchecker::dbm::tighten(tchecker::dbm::db_t *, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::clock_id_t)"
                 );
  }
  if (dim == 0) {
    __assert_fail("dim >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0xc1,
                  "enum tchecker::dbm::status_t tchecker::dbm::tighten(tchecker::dbm::db_t *, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::clock_id_t)"
                 );
  }
  bVar1 = operator==(dbm + (x * dim + y),(db_t *)&LT_INFINITY);
  if (!bVar1) {
    for (j = 0; j < dim; j = j + 1) {
      if (j != x) {
        local_2c = sum(dbm + (j * dim + x),dbm + (x * dim + (int)db_ixy));
        bVar1 = operator<(&local_2c,dbm + (j * dim + (int)db_ixy));
        if (bVar1) {
          dbm[j * dim + (int)db_ixy] = local_2c;
        }
      }
      for (local_30 = 0; local_30 < dim; local_30 = local_30 + 1) {
        uVar2 = j * dim + local_30;
        local_38 = sum(dbm + (j * dim + (int)db_ixy),dbm + ((int)db_ixy * dim + local_30));
        local_34 = min(dbm + uVar2,&local_38);
        dbm[j * dim + local_30] = local_34;
      }
      bVar1 = operator<(dbm + (j * dim + j),(db_t *)&LE_ZERO);
      if (bVar1) {
        *dbm = (db_t)0x0;
        return EMPTY;
      }
    }
  }
  return MAY_BE_EMPTY;
}

Assistant:

enum tchecker::dbm::status_t tighten(tchecker::dbm::db_t * dbm, tchecker::clock_id_t dim, tchecker::clock_id_t x,
                                     tchecker::clock_id_t y)
{
  assert(dbm != nullptr);
  assert(dim >= 1);

  if (DBM(x, y) == tchecker::dbm::LT_INFINITY)
    return tchecker::dbm::MAY_BE_EMPTY;

  for (tchecker::clock_id_t i = 0; i < dim; ++i) {
    // tighten i->y w.r.t. i->x->y
    if (i != x) {
      tchecker::dbm::db_t db_ixy = tchecker::dbm::sum(DBM(i, x), DBM(x, y));
      if (db_ixy < DBM(i, y))
        DBM(i, y) = db_ixy;
    }

    // tighten i->j w.r.t. i->y->j
    for (tchecker::clock_id_t j = 0; j < dim; ++j)
      DBM(i, j) = tchecker::dbm::min(DBM(i, j), tchecker::dbm::sum(DBM(i, y), DBM(y, j)));

    if (DBM(i, i) < tchecker::dbm::LE_ZERO) {
      DBM(0, 0) = tchecker::dbm::LT_ZERO;
      return tchecker::dbm::EMPTY;
    }
  }

  return tchecker::dbm::MAY_BE_EMPTY;
}